

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,PromiseClient *this
          ,uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint)

{
  ushort uVar1;
  bool bVar2;
  uint64_t uVar3;
  RpcConnectionState *pRVar4;
  ClientHook *pCVar5;
  Maybe<capnp::MessageSize> local_90;
  Maybe<capnp::MessageSize> local_78;
  ForkedPromise<kj::Own<capnp::ClientHook>_> local_50;
  Own<capnp::ClientHook> local_40;
  Maybe<capnp::MessageSize> *local_30;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint64_t uStack_20;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  PromiseClient *this_local;
  
  local_30 = sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_20 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local = (PromiseClient *)__return_storage_ptr__;
  if ((((this->isResolved & 1U) == 0) &&
      (uVar3 = typeId<capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>,capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::_capnpPrivate>
                         (), interfaceId == uVar3)) && (sizeHint_local._6_2_ == 0)) {
    pRVar4 = kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::operator->
                       (&(this->super_RpcClient).connectionState);
    bVar2 = kj::
            Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
            ::operator!=(&pRVar4->gateway,(void *)0x0);
    if (bVar2) {
      kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch(&local_50);
      newLocalPromiseClient((capnp *)&local_40,(Promise<kj::Own<capnp::ClientHook>_> *)&local_50);
      pCVar5 = kj::Own<capnp::ClientHook>::operator->(&local_40);
      uVar3 = uStack_20;
      uVar1 = sizeHint_local._6_2_;
      kj::Maybe<capnp::MessageSize>::Maybe(&local_78,sizeHint);
      (**pCVar5->_vptr_ClientHook)(__return_storage_ptr__,pCVar5,uVar3,(ulong)uVar1,&local_78);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_78);
      kj::Own<capnp::ClientHook>::~Own(&local_40);
      kj::Promise<kj::Own<capnp::ClientHook>_>::~Promise
                ((Promise<kj::Own<capnp::ClientHook>_> *)&local_50);
      return __return_storage_ptr__;
    }
  }
  this->receivedCall = true;
  pCVar5 = kj::Own<capnp::ClientHook>::operator->(&this->cap);
  uVar3 = uStack_20;
  uVar1 = sizeHint_local._6_2_;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_90,sizeHint);
  (**pCVar5->_vptr_ClientHook)(__return_storage_ptr__,pCVar5,uVar3,(ulong)uVar1,&local_90);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
      if (!isResolved && interfaceId == typeId<Persistent<>>() && methodId == 0 &&
          connectionState->gateway != nullptr) {
        // This is a call to Persistent.save(), and we're not resolved yet, and the underlying
        // remote capability will perform a gateway translation. This isn't right if the promise
        // ultimately resolves to a local capability. Instead, we'll need to queue the call until
        // the promise resolves.
        return newLocalPromiseClient(fork.addBranch())
            ->newCall(interfaceId, methodId, sizeHint);
      }

      receivedCall = true;
      return cap->newCall(interfaceId, methodId, sizeHint);
    }